

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O3

void * mk_sched_launch_worker_loop(void *data)

{
  mk_server *server;
  long *plVar1;
  int iVar2;
  void *pvVar3;
  pthread_t pVar4;
  long lVar5;
  mk_event_loop *pmVar6;
  mk_list *pmVar7;
  long lVar8;
  long lVar9;
  undefined8 *__pointer;
  char *thread_name;
  unsigned_long len;
  sigset_t set;
  char *local_128;
  __sigset_t local_120;
  sigset_t local_a0;
  
  local_128 = (char *)0x0;
  server = *data;
  plVar1 = (long *)server->sched_ctx;
  sigemptyset(&local_a0);
  sigaddset(&local_a0,0xd);
  pthread_sigmask(0,&local_a0,&local_120);
  pvVar3 = malloc(0x10);
  if (pvVar3 == (void *)0x0) {
    perror("malloc");
  }
  *(void **)((long)pvVar3 + 8) = pvVar3;
  *(void **)pvVar3 = pvVar3;
  pthread_setspecific(mk_tls_sched_cs_incomplete,pvVar3);
  mk_cache_worker_init();
  mk_vhost_fdt_worker_init(server);
  lVar8 = *server->sched_ctx;
  iVar2 = server->worker_id;
  server->worker_id = iVar2 + 1;
  lVar8 = lVar8 + (long)iVar2 * 0xa0;
  lVar9 = lVar8 + 0x20;
  *(short *)(lVar8 + 0x30) = (short)iVar2;
  pVar4 = pthread_self();
  *(pthread_t *)(lVar8 + 0x38) = pVar4;
  lVar5 = syscall(0xba);
  *(int *)(lVar8 + 0x40) = (int)lVar5;
  *(long *)(lVar8 + 0x28) = lVar9;
  *(long *)lVar9 = lVar9;
  *(undefined8 *)(lVar8 + 0x48) = 0;
  lVar5 = *plVar1;
  lVar8 = (long)*(short *)(lVar8 + 0x30) * 0xa0;
  pmVar6 = mk_event_loop_create(0x100);
  *(mk_event_loop **)(lVar5 + lVar8) = pmVar6;
  if (pmVar6 == (mk_event_loop *)0x0) {
    mk_print(0x1001,"Error creating Scheduler loop");
  }
  else {
    __pointer = (undefined8 *)(lVar5 + lVar8);
    iVar2 = mk_utils_get_system_page_size();
    *(int *)((long)__pointer + 0x44) = iVar2;
    pvVar3 = calloc(1,0x48);
    pthread_setspecific(mk_tls_sched_worker_notif,pvVar3);
    iVar2 = mk_event_channel_create
                      ((mk_event_loop *)*__pointer,(int *)(__pointer + 0xc),
                       (int *)((long)__pointer + 100),pvVar3);
    if (-1 < iVar2) {
      __pointer[0xb] = __pointer + 10;
      __pointer[10] = __pointer + 10;
      __pointer[0x11] = __pointer + 0x10;
      __pointer[0x10] = __pointer + 0x10;
      __pointer[0x13] = __pointer + 0x12;
      __pointer[0x12] = __pointer + 0x12;
      mk_string_build(&local_128,local_120.__val,"monkey: wrk/%i",
                      (ulong)(uint)(int)*(short *)(__pointer + 6));
      mk_utils_worker_rename(local_128);
      free(local_128);
      pthread_setspecific(mk_tls_sched_worker_node,__pointer);
      mk_plugin_core_thread(server);
      if (server->scheduler_mode == '\x01') {
        pmVar7 = mk_server_listen_init(server);
        __pointer[0xd] = pmVar7;
        if (pmVar7 == (mk_list *)0x0) goto LAB_0010984b;
      }
      pthread_mutex_lock((pthread_mutex_t *)&server->pth_mutex);
      server->pth_init = 1;
      pthread_cond_signal((pthread_cond_t *)&server->pth_cond);
      pthread_mutex_unlock((pthread_mutex_t *)&server->pth_mutex);
      for (pmVar7 = (server->sched_worker_callbacks).next; pmVar7 != &server->sched_worker_callbacks
          ; pmVar7 = pmVar7->next) {
        (*(code *)pmVar7[-1].prev)(pmVar7[-1].next);
      }
      free(data);
      mk_server_worker_loop(server);
      return (void *)0x0;
    }
  }
LAB_0010984b:
  exit(1);
}

Assistant:

void *mk_sched_launch_worker_loop(void *data)
{
    int ret;
    int wid;
    unsigned long len;
    char *thread_name = 0;
    struct mk_list *head;
    struct mk_sched_worker_cb *wcb;
    struct mk_sched_worker *sched = NULL;
    struct mk_sched_notif *notif = NULL;
    struct mk_sched_thread_conf *thinfo = data;
    struct mk_sched_ctx *ctx;
    struct mk_server *server;

    server = thinfo->server;
    ctx = server->sched_ctx;

    /* Avoid SIGPIPE signals on this thread */
    mk_signal_thread_sigpipe_safe();

    /* Init specific thread cache */
    mk_sched_thread_lists_init();
    mk_cache_worker_init();

    /* Virtual hosts: initialize per thread-vhost data */
    mk_vhost_fdt_worker_init(server);

    /* Register working thread */
    wid = mk_sched_register_thread(server);
    sched = &ctx->workers[wid];
    sched->loop = mk_event_loop_create(MK_EVENT_QUEUE_SIZE);
    if (!sched->loop) {
        mk_err("Error creating Scheduler loop");
        exit(EXIT_FAILURE);
    }


    sched->mem_pagesize = mk_utils_get_system_page_size();

    /*
     * Create the notification instance and link it to the worker
     * thread-scope list.
     */
    notif = mk_mem_alloc_z(sizeof(struct mk_sched_notif));
    MK_TLS_SET(mk_tls_sched_worker_notif, notif);

    /* Register the scheduler channel to signal active workers */
    ret = mk_event_channel_create(sched->loop,
                                  &sched->signal_channel_r,
                                  &sched->signal_channel_w,
                                  notif);
    if (ret < 0) {
        exit(EXIT_FAILURE);
    }

    mk_list_init(&sched->event_free_queue);
    mk_list_init(&sched->threads);
    mk_list_init(&sched->threads_purge);

    /*
     * ULONG_MAX BUG test only
     * =======================
     * to test the workaround we can use the following value:
     *
     *  thinfo->closed_connections = 1000;
     */

    //thinfo->ctx = thconf->ctx;

    /* Rename worker */
    mk_string_build(&thread_name, &len, "monkey: wrk/%i", sched->idx);
    mk_utils_worker_rename(thread_name);
    mk_mem_free(thread_name);

    /* Export known scheduler node to context thread */
    MK_TLS_SET(mk_tls_sched_worker_node, sched);
    mk_plugin_core_thread(server);

    if (server->scheduler_mode == MK_SCHEDULER_REUSEPORT) {
        sched->listeners = mk_server_listen_init(server);
        if (!sched->listeners) {
            exit(EXIT_FAILURE);
        }
    }

    /* Unlock the conditional initializator */
    pthread_mutex_lock(&server->pth_mutex);
    server->pth_init = MK_TRUE;
    pthread_cond_signal(&server->pth_cond);
    pthread_mutex_unlock(&server->pth_mutex);

    /* Invoke custom worker-callbacks defined by the scheduler (lib) */
    mk_list_foreach(head, &server->sched_worker_callbacks) {
        wcb = mk_list_entry(head, struct mk_sched_worker_cb, _head);
        wcb->cb_func(wcb->data);
    }

    mk_mem_free(thinfo);

    /* init server thread loop */
    mk_server_worker_loop(server);

    return 0;
}